

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O3

itexture_comp * crnlib::create_texture_comp(crn_file_type file_type)

{
  crn_comp *this;
  
  if (file_type == cCRNFileTypeDDS) {
    this = (crn_comp *)crnlib_malloc(0x1048);
    dds_comp::dds_comp((dds_comp *)this);
  }
  else if (file_type == cCRNFileTypeCRN) {
    this = (crn_comp *)crnlib_malloc(0x2180);
    crn_comp::crn_comp(this);
  }
  else {
    this = (crn_comp *)0x0;
  }
  return &this->super_itexture_comp;
}

Assistant:

static itexture_comp* create_texture_comp(crn_file_type file_type)
    {
        if (file_type == cCRNFileTypeCRN)
        {
            return crnlib_new<crn_comp>();
        }
        else if (file_type == cCRNFileTypeDDS)
        {
            return crnlib_new<dds_comp>();
        }
        else
        {
            return nullptr;
        }
    }